

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_version_manager.cpp
# Opt level: O1

shared_ptr<duckdb::RowVersionManager,_true>
duckdb::RowVersionManager::Deserialize
          (MetaBlockPointer delete_pointer,MetadataManager *manager,idx_t start)

{
  _Head_base<0UL,_duckdb::ChunkInfo_*,_false> _Var1;
  undefined8 uVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  RowVersionManager *pRVar3;
  reference pvVar4;
  IOException *this_00;
  MetadataManager *extraout_RDX;
  pointer *__ptr;
  element_type *this_01;
  idx_t in_R8;
  ChunkInfo *pCVar5;
  shared_ptr<duckdb::RowVersionManager,_true> sVar6;
  MetaBlockPointer pointer;
  unsigned_long value;
  MetadataReader source;
  undefined1 local_c8 [32];
  MetadataManager *local_a8;
  MetadataReader local_a0;
  
  this_01 = (element_type *)delete_pointer.block_pointer;
  if (delete_pointer._8_8_ == 0xffffffffffffffff) {
    (this_01->version_lock).super___mutex_base._M_mutex.__align = 0;
    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
    ((long)&(this_01->version_lock).super___mutex_base._M_mutex + 8))->_M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    local_a8 = manager;
    this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x78);
    this->_M_use_count = 1;
    this->_M_weak_count = 1;
    this->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_019aec98;
    RowVersionManager((RowVersionManager *)(this + 1),in_R8);
    (this_01->version_lock).super___mutex_base._M_mutex.__align = (long)(this + 1);
    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
    ((long)&(this_01->version_lock).super___mutex_base._M_mutex + 8))->_M_pi = this;
    if (__libc_single_threaded == '\0') {
      LOCK();
      this->_M_use_count = this->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this->_M_use_count = this->_M_use_count + 1;
    }
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
    pRVar3 = shared_ptr<duckdb::RowVersionManager,_true>::operator->
                       ((shared_ptr<duckdb::RowVersionManager,_true> *)this_01);
    pointer._8_8_ = local_a8;
    pointer.block_pointer = delete_pointer._8_8_;
    MetadataReader::MetadataReader
              (&local_a0,(MetadataManager *)start,pointer,
               (optional_ptr<duckdb::vector<duckdb::MetaBlockPointer,_true>,_true>)
               &pRVar3->storage_pointers,EXISTING_BLOCKS);
    (**local_a0.super_ReadStream._vptr_ReadStream)(&local_a0,local_c8,8);
    if ((ChunkInfo *)local_c8._0_8_ != (ChunkInfo *)0x0) {
      pCVar5 = (ChunkInfo *)local_c8._0_8_;
      do {
        (**local_a0.super_ReadStream._vptr_ReadStream)(&local_a0,local_c8,8);
        uVar2 = local_c8._0_8_;
        if ((local_c8._0_8_ & 0x1ffffffff80000) != 0) {
          this_00 = (IOException *)__cxa_allocate_exception(0x10);
          local_c8._0_8_ = local_c8 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_c8,
                     "In DeserializeDeletes, vector_index %llu is out of range for the max row group size of %llu. Corrupted file?"
                     ,"");
          IOException::IOException<unsigned_long,unsigned_long>
                    (this_00,(string *)local_c8,uVar2,0x40000000);
          __cxa_throw(this_00,&IOException::typeinfo,::std::runtime_error::~runtime_error);
        }
        pRVar3 = shared_ptr<duckdb::RowVersionManager,_true>::operator->
                           ((shared_ptr<duckdb::RowVersionManager,_true> *)this_01);
        FillVectorInfo(pRVar3,uVar2);
        ChunkInfo::Read((ChunkInfo *)local_c8,&local_a0.super_ReadStream);
        pRVar3 = shared_ptr<duckdb::RowVersionManager,_true>::operator->
                           ((shared_ptr<duckdb::RowVersionManager,_true> *)this_01);
        pvVar4 = vector<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>,_true>
                 ::operator[](&pRVar3->vector_info,uVar2);
        uVar2 = local_c8._0_8_;
        local_c8._0_8_ = (ChunkInfo *)0x0;
        _Var1._M_head_impl =
             (pvVar4->super_unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>_>).
             _M_t.super___uniq_ptr_impl<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::ChunkInfo_*,_std::default_delete<duckdb::ChunkInfo>_>.
             super__Head_base<0UL,_duckdb::ChunkInfo_*,_false>._M_head_impl;
        (pvVar4->super_unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>_>)._M_t.
        super___uniq_ptr_impl<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::ChunkInfo_*,_std::default_delete<duckdb::ChunkInfo>_>.
        super__Head_base<0UL,_duckdb::ChunkInfo_*,_false>._M_head_impl = (ChunkInfo *)uVar2;
        if (_Var1._M_head_impl != (ChunkInfo *)0x0) {
          (**(code **)((long)(_Var1._M_head_impl)->_vptr_ChunkInfo + 8))();
        }
        pCVar5 = (ChunkInfo *)&pCVar5[-1].field_0x17;
      } while (pCVar5 != (ChunkInfo *)0x0);
    }
    pRVar3 = shared_ptr<duckdb::RowVersionManager,_true>::operator->
                       ((shared_ptr<duckdb::RowVersionManager,_true> *)this_01);
    pRVar3->has_changes = false;
    MetadataReader::~MetadataReader(&local_a0);
    manager = extraout_RDX;
  }
  sVar6.internal.super___shared_ptr<duckdb::RowVersionManager,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)manager;
  sVar6.internal.super___shared_ptr<duckdb::RowVersionManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       this_01;
  return (shared_ptr<duckdb::RowVersionManager,_true>)
         sVar6.internal.super___shared_ptr<duckdb::RowVersionManager,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<RowVersionManager> RowVersionManager::Deserialize(MetaBlockPointer delete_pointer, MetadataManager &manager,
                                                             idx_t start) {
	if (!delete_pointer.IsValid()) {
		return nullptr;
	}
	auto version_info = make_shared_ptr<RowVersionManager>(start);
	MetadataReader source(manager, delete_pointer, &version_info->storage_pointers);
	auto chunk_count = source.Read<idx_t>();
	D_ASSERT(chunk_count > 0);
	for (idx_t i = 0; i < chunk_count; i++) {
		idx_t vector_index = source.Read<idx_t>();
		if (vector_index * STANDARD_VECTOR_SIZE >= Storage::MAX_ROW_GROUP_SIZE) {
			throw IOException("In DeserializeDeletes, vector_index %llu is out of range for the max row group size of "
			                  "%llu. Corrupted file?",
			                  vector_index, Storage::MAX_ROW_GROUP_SIZE);
		}

		version_info->FillVectorInfo(vector_index);
		version_info->vector_info[vector_index] = ChunkInfo::Read(source);
	}
	version_info->has_changes = false;
	return version_info;
}